

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_StringCacheKey::Run(void)

{
  byte bVar1;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  Template *local_108;
  Template *tpl2;
  Template *tpl1;
  TemplateDictionary local_d8 [8];
  TemplateDictionary empty_dict;
  allocator local_61;
  string local_60 [8];
  string text;
  allocator local_29;
  string local_28 [8];
  string cache_key_a;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"cache key a",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Test template 1",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl1,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_d8,(TemplateString *)&tpl1,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_128,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_148,(string *)local_60);
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_128,&local_148);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x47d,"Template::StringToTemplateCache(cache_key_a, text)"
          );
    ctemplate::TemplateString::TemplateString(&local_168,(string *)local_28);
    ctemplate::TemplateString::TemplateString(&local_188,(string *)local_60);
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_168,&local_188);
    if ((bVar1 & 1) == 0) {
      __assert_fail("Template::StringToTemplateCache(cache_key_a, text)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x47d,"static void Test_Template_StringCacheKey::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1a8,(string *)local_28);
  tpl2 = (Template *)ctemplate::Template::GetTemplate(&local_1a8,DO_NOT_STRIP);
  ctemplate::AssertExpandIs(tpl2,local_d8,(string *)local_60,true);
  ctemplate::TemplateString::TemplateString(&local_1c8,(string *)local_28);
  local_108 = (Template *)ctemplate::Template::GetTemplate(&local_1c8,STRIP_BLANK_LINES);
  if (local_108 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x482,
           "tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES)");
    ctemplate::TemplateString::TemplateString(&local_1e8,(string *)local_28);
    local_108 = (Template *)ctemplate::Template::GetTemplate(&local_1e8,STRIP_BLANK_LINES);
    if (local_108 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x482,"static void Test_Template_StringCacheKey::Run()");
  }
  if (local_108 != tpl2) {
    ctemplate::AssertExpandIs(local_108,local_d8,(string *)local_60,true);
    ctemplate::Template::ClearCache();
    ctemplate::TemplateDictionary::~TemplateDictionary(local_d8);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_28);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x483,"tpl2 != tpl1");
  if (local_108 != tpl2) {
    exit(1);
  }
  __assert_fail("tpl2 != tpl1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x483,"static void Test_Template_StringCacheKey::Run()");
}

Assistant:

TEST(Template, StringCacheKey) {
  // If you use these same cache keys somewhere else,
  // call Template::ClearCache first.
  const string cache_key_a = "cache key a";
  const string text = "Test template 1";
  TemplateDictionary empty_dict("dict");

  // When a string template is registered via StringToTemplateCache,
  // we can use GetTemplate for that same cache-key under any other
  // Strip because we cache the contents.
  Template *tpl1, *tpl2;
  ASSERT(Template::StringToTemplateCache(cache_key_a, text));
  tpl1 = Template::GetTemplate(cache_key_a, DO_NOT_STRIP);
  AssertExpandIs(tpl1, &empty_dict, text, true);

  // Different strip.
  ASSERT(tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl1);
  AssertExpandIs(tpl2, &empty_dict, text, true);

  Template::ClearCache();
}